

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attr.c
# Opt level: O1

int get_string_attr(attr_list l,atom_t attr_id,char **valp)

{
  int iVar1;
  int iVar2;
  attr_value_type t;
  attr_union v;
  attr_value_type local_1c;
  anon_union_16_6_0081cd67_for_u local_18;
  
  iVar1 = query_pattr(l,attr_id,&local_1c,(attr_union *)&local_18.o);
  iVar2 = 0;
  if ((iVar1 != 0) && (local_1c == Attr_String)) {
    *valp = (char *)local_18.d;
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

int
get_string_attr(attr_list l, atom_t attr_id, char **valp)
{
    attr_value_type t;
    attr_union v;
    int ret = query_pattr(l, attr_id, &t, &v);
    if (ret == 0) return 0;
    switch(t) {
    case Attr_String:
	*valp = v.u.p;
	break;
    default:
	return 0;
    }
    return 1;
}